

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetItemSetter
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var *setterValue,ScriptContext *requestContext)

{
  bool bVar1;
  byte bVar2;
  BOOL BVar3;
  IndexPropertyDescriptorMap *this_00;
  void **ppvVar4;
  ES5Array *pEVar5;
  IndexPropertyDescriptor *local_48;
  IndexPropertyDescriptor *descriptor;
  ScriptContext *requestContext_local;
  Var *setterValue_local;
  DynamicObject *pDStack_28;
  uint32 index_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  descriptor = (IndexPropertyDescriptor *)requestContext;
  requestContext_local = (ScriptContext *)setterValue;
  setterValue_local._4_4_ = index;
  pDStack_28 = instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                      (&this->indexPropertyMap);
  bVar1 = IndexPropertyDescriptorMap::TryGetReference(this_00,setterValue_local._4_4_,&local_48);
  if (bVar1) {
    if ((local_48->Attributes & 8) != 0) {
      return None;
    }
    pEVar5 = VarTo<Js::ES5Array,Js::DynamicObject>(pDStack_28);
    BVar3 = HasDataItem(this,pEVar5,setterValue_local._4_4_);
    if (BVar3 != 0) {
      if ((local_48->Attributes & 4) == 0) {
        return Data;
      }
      return WritableData;
    }
    ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&local_48->Setter)
    ;
    if (*ppvVar4 != (void *)0x0) {
      ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&local_48->Setter);
      (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo =
           (_func_int **)*ppvVar4;
      return Accessor;
    }
  }
  else {
    pEVar5 = VarTo<Js::ES5Array,Js::DynamicObject>(pDStack_28);
    BVar3 = HasDataItem(this,pEVar5,setterValue_local._4_4_);
    if (BVar3 != 0) {
      bVar2 = GetDataItemAttributes(this);
      if ((bVar2 & 4) == 0) {
        return Data;
      }
      return WritableData;
    }
  }
  return None;
}

Assistant:

DescriptorFlags ES5ArrayTypeHandlerBase<T>::GetItemSetter(ES5Array* arr, DynamicObject* instance, uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return None;
            }

            if (HasDataItem(VarTo<ES5Array>(instance), index))
            {
                // not a setter but shadows
                return (descriptor->Attributes & PropertyWritable) ? WritableData : Data;
            }
            else if (descriptor->Setter)
            {
                *setterValue = descriptor->Setter;
                return Accessor;
            }
        }
        else if (HasDataItem(VarTo<ES5Array>(instance), index))
        {
            return (GetDataItemAttributes() & PropertyWritable) ? WritableData : Data;
        }

        return None;
    }